

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstream.h
# Opt level: O2

uint64_t bitstream_get_bits(bitstream_t *bs,uint num_bits)

{
  byte bVar1;
  sbyte sVar2;
  uint uVar3;
  uint64_t uVar4;
  ulong uVar5;
  int iVar6;
  byte *pbVar7;
  uint uVar8;
  uint uVar9;
  
  uVar5 = bs->position;
  uVar8 = (uint)uVar5 & 7;
  bs->position = num_bits + uVar5;
  uVar9 = 8 - uVar8;
  sVar2 = ((byte)uVar9 < 0x21) * (' ' - (byte)uVar9);
  uVar3 = ((uint)(bs->buffer).w[uVar5 >> 3] << sVar2) >> sVar2;
  uVar4 = (uint64_t)uVar3;
  if (uVar9 < num_bits) {
    pbVar7 = (bs->buffer).w + (uVar5 >> 3) + 1;
    iVar6 = (num_bits - 0x10) + uVar8;
    for (uVar5 = (ulong)(num_bits - uVar9); 7 < (uint)uVar5; uVar5 = uVar5 - 8) {
      bVar1 = *pbVar7;
      pbVar7 = pbVar7 + 1;
      iVar6 = iVar6 + -8;
      uVar4 = uVar4 << 8 | (ulong)bVar1;
    }
    if ((uint)uVar5 != 0) {
      sVar2 = ((byte)uVar5 < 0x21) * (' ' - (byte)uVar5);
      uVar4 = (ulong)(((uint)(*pbVar7 >> ((byte)-(char)iVar6 & 0x1f)) << sVar2) >> sVar2) |
              uVar4 << (uVar5 & 0x3f);
    }
    return uVar4;
  }
  return (ulong)(uVar3 >> ((ulong)(uVar9 - num_bits) & 0x3f));
}

Assistant:

static inline uint64_t bitstream_get_bits(bitstream_t* bs, unsigned int num_bits) {
  ASSUME(1 <= num_bits && num_bits <= 64);

  const uint8_t* p              = &bs->buffer.r[bs->position / 8];
  const unsigned int skip_bits  = bs->position % 8;
  const unsigned int start_bits = 8 - skip_bits;

  bs->position += num_bits;
  uint64_t ret = (*p++ & ((1 << start_bits) - 1));

  if (num_bits <= start_bits) {
    return ret >> (start_bits - num_bits);
  }

  num_bits -= start_bits;
  for (; num_bits >= 8; num_bits -= 8, ++p) {
    ret = ret << 8 | *p;
  }

  if (num_bits > 0) {
    ret = ret << num_bits | ((*p >> (8 - num_bits)) & ((1 << num_bits) - 1));
  }

  return ret;
}